

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O3

int Abc_CommandCone(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Wlc_Ntk_t *pWVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  uint fAllPis;
  uint local_4c;
  uint local_48;
  uint local_44;
  
  pWVar5 = (Wlc_Ntk_t *)pAbc->pAbcWlc;
  fAllPis = 0;
  Extra_UtilGetoptReset();
  local_4c = 1;
  local_44 = 0xffffffff;
  local_48 = 0;
  bVar1 = false;
LAB_003563bd:
  do {
    while (iVar3 = Extra_UtilGetopt(argc,argv,"ORisvh"), iVar2 = globalUtilOptind, iVar3 == 0x76) {
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (iVar3 < 0x52) {
      if (iVar3 == -1) {
        if (pWVar5 == (Wlc_Ntk_t *)0x0) {
          Abc_Print(1,"Abc_CommandCone(): There is no current design.\n");
          return 0;
        }
        if (-1 < (int)local_44 && (int)local_44 < (pWVar5->vCos).nSize) {
          pcVar7 = "sequential";
          if (local_48 == 0) {
            pcVar7 = "combinational";
          }
          printf("Extracting output %d as a %s word-level network.\n",(ulong)local_44,pcVar7);
          pcVar7 = Wlc_NtkNewName(pWVar5,local_44,local_48);
          Wlc_NtkMarkCone(pWVar5,local_44,local_4c,local_48,fAllPis);
          pWVar5 = Wlc_NtkDupDfs(pWVar5,1,local_48);
          if (pWVar5->pName != (char *)0x0) {
            free(pWVar5->pName);
            pWVar5->pName = (char *)0x0;
          }
          if (pcVar7 == (char *)0x0) {
            pcVar8 = (char *)0x0;
          }
          else {
            sVar6 = strlen(pcVar7);
            pcVar8 = (char *)malloc(sVar6 + 1);
            strcpy(pcVar8,pcVar7);
          }
          pWVar5->pName = pcVar8;
          if ((Wlc_Ntk_t *)pAbc->pAbcWlc != (Wlc_Ntk_t *)0x0) {
            Wlc_NtkFree((Wlc_Ntk_t *)pAbc->pAbcWlc);
          }
          pAbc->pAbcWlc = pWVar5;
          return 0;
        }
        Abc_Print(1,"Abc_CommandCone(): Illegal output index (%d) (should be 0 <= num < %d).\n",
                  (ulong)local_44);
        return 0;
      }
      if (iVar3 != 0x4f) goto LAB_003565b5;
      if (argc <= globalUtilOptind) {
        pcVar7 = "Command line switch \"-O\" should be followed by an integer.\n";
LAB_003565a9:
        Abc_Print(-1,pcVar7);
        goto LAB_003565b5;
      }
      uVar4 = atoi(argv[globalUtilOptind]);
      local_44 = uVar4;
    }
    else {
      if (iVar3 != 0x52) {
        if (iVar3 == 0x69) {
          fAllPis = fAllPis ^ 1;
        }
        else {
          if (iVar3 != 0x73) goto LAB_003565b5;
          local_48 = local_48 ^ 1;
        }
        goto LAB_003563bd;
      }
      if (argc <= globalUtilOptind) {
        pcVar7 = "Command line switch \"-R\" should be followed by an integer.\n";
        goto LAB_003565a9;
      }
      uVar4 = atoi(argv[globalUtilOptind]);
      local_4c = uVar4;
    }
    globalUtilOptind = iVar2 + 1;
    if ((int)uVar4 < 0) {
LAB_003565b5:
      Abc_Print(-2,"usage: %%cone [-OR num] [-isvh]\n");
      Abc_Print(-2,"\t         extracts logic cone of one or more word-level outputs\n");
      Abc_Print(-2,
                "\t-O num : zero-based index of the first word-level output to extract [default = %d]\n"
                ,(ulong)local_44);
      Abc_Print(-2,"\t-R num : total number of word-level outputs to extract [default = %d]\n",
                (ulong)local_4c);
      pcVar8 = "yes";
      pcVar7 = "yes";
      if (fAllPis == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-i     : toggle using support composed of all primary inputs [default = %s]\n"
                ,pcVar7);
      pcVar7 = "yes";
      if (local_48 == 0) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-s     : toggle performing extracting sequential cones [default = %s]\n",
                pcVar7);
      if (!bVar1) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar8);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandCone( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Wlc_Ntk_t * pNtk = Wlc_AbcGetNtk(pAbc);
    int c, iOutput = -1, Range = 1, fAllPis = 0, fSeq = 0, fVerbose  = 0;
    char * pName;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ORisvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'O':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-O\" should be followed by an integer.\n" );
                goto usage;
            }
            iOutput = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( iOutput < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            Range = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Range < 0 )
                goto usage;
            break;
        case 'i':
            fAllPis ^= 1;
            break;
        case 's':
            fSeq ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( 1, "Abc_CommandCone(): There is no current design.\n" );
        return 0;
    }
    if ( iOutput < 0 || iOutput >= Wlc_NtkCoNum(pNtk) )
    {
        Abc_Print( 1, "Abc_CommandCone(): Illegal output index (%d) (should be 0 <= num < %d).\n", iOutput, Wlc_NtkCoNum(pNtk) );
        return 0;
    }
    printf( "Extracting output %d as a %s word-level network.\n", iOutput, fSeq ? "sequential" : "combinational" );
    pName = Wlc_NtkNewName( pNtk, iOutput, fSeq );
    Wlc_NtkMarkCone( pNtk, iOutput, Range, fSeq, fAllPis );
    pNtk = Wlc_NtkDupDfs( pNtk, 1, fSeq );
    ABC_FREE( pNtk->pName );
    pNtk->pName = Abc_UtilStrsav( pName );
    Wlc_AbcUpdateNtk( pAbc, pNtk );
    return 0;
usage:
    Abc_Print( -2, "usage: %%cone [-OR num] [-isvh]\n" );
    Abc_Print( -2, "\t         extracts logic cone of one or more word-level outputs\n" );
    Abc_Print( -2, "\t-O num : zero-based index of the first word-level output to extract [default = %d]\n", iOutput );
    Abc_Print( -2, "\t-R num : total number of word-level outputs to extract [default = %d]\n", Range );
    Abc_Print( -2, "\t-i     : toggle using support composed of all primary inputs [default = %s]\n", fAllPis? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle performing extracting sequential cones [default = %s]\n", fSeq? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}